

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::
build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
          (exhaustive_solver<baryonyx::itm::maximize_tag,double> *this,int k,
          vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
          *constraint_elements,int bk_min,int bk_max)

{
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *this_00;
  long lVar1;
  int iVar2;
  int j_1;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int nb_solution;
  int start_it_flat_constraints;
  uint local_68;
  uint local_64;
  ulong local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *local_40;
  ulong local_38;
  
  uVar4 = (long)(constraint_elements->
                super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(constraint_elements->
                super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_64 = 0;
  local_38 = (ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18)) >> 2;
  local_50 = (int)local_38;
  local_58 = bk_min;
  local_54 = bk_max;
  local_4c = bk_max;
  local_48 = bk_min;
  local_44 = k;
  if (k < 0) {
    details::fail_fast("Postcondition","k >= 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                       ,"121");
  }
  uVar3 = (uint)(uVar4 >> 3);
  if ((int)uVar3 < 1) {
    details::fail_fast("Postcondition","constraint_size > 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                       ,"122");
  }
  this_00 = this + 0x30;
  local_68 = local_68 & 0xffffff00;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,(long)uVar4 >> 3,
             (value_type_conflict *)&local_68);
  uVar4 = (ulong)(uVar3 & 0x7fffffff);
  local_60 = 0;
  *(undefined1 *)(*(long *)(this + 0x38) + -1) = 1;
  lVar1 = *(long *)(this + 0x30);
  local_40 = this;
  do {
    lVar6 = (long)(*(int *)(local_40 + 0x38) - (int)lVar1);
    while( true ) {
      lVar1 = *(long *)this_00;
      iVar2 = 0;
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        if (*(char *)(lVar1 + uVar5) != '\0') {
          iVar2 = iVar2 + (constraint_elements->
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar5].factor;
        }
      }
      if (iVar2 <= local_54 && local_58 <= iVar2) {
        local_64 = (int)local_60 + 1;
        local_60 = (ulong)local_64;
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          if (*(char *)(*(long *)this_00 + uVar5) == '\0') {
            local_68 = 0;
          }
          else {
            local_68 = (constraint_elements->
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar5].factor;
          }
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)(this + 0x18),(int *)&local_68);
        }
        lVar1 = *(long *)this_00;
      }
      lVar6 = lVar6 + -1;
      *(char *)(lVar1 + lVar6) = *(char *)(lVar1 + lVar6) + '\x01';
      lVar1 = *(long *)this_00;
      if (*(char *)(lVar1 + lVar6) < '\x02') break;
      *(undefined1 *)(lVar1 + lVar6) = 0;
      if (lVar6 == 0) {
        if ((int)local_38 < 0) {
          details::fail_fast("Precondition","start_it_flat_constraints >= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                             ,"162");
        }
        if ((int)local_60 < 1) {
          details::fail_fast("Precondition","nb_solution > 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                             ,"163");
        }
        std::
        _Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>>
        ::_M_emplace_unique<int&,int_const&,int&,int&,int&>
                  ((_Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>>
                    *)(local_40 + 0x48),&local_44,&local_50,(int *)&local_64,&local_48,&local_4c);
        return;
      }
    }
  } while( true );
}

Assistant:

void build_constraints(int k,
                           const C& constraint_elements,
                           int bk_min,
                           int bk_max)
    {
        const auto constraint_size = length(constraint_elements);
        const auto start_it_flat_constraints = length(flat_constraints);
        auto nb_solution = 0;

        bx_ensures(k >= 0);
        bx_ensures(constraint_size > 0);

        walkers.resize(constraint_elements.size(), 0);
        walkers.back() = 1;
        bool end = false;

        do {
            auto i = length(walkers) - 1;

            do {
                int sum = 0;
                for (int j = 0; j != constraint_size; ++j)
                    if (walkers[j])
                        sum += constraint_elements[j].factor;

                if (bk_min <= sum && sum <= bk_max) {
                    ++nb_solution;
                    for (int j = 0; j != constraint_size; ++j) {
                        flat_constraints.emplace_back(
                          walkers[j] ? constraint_elements[j].factor : 0);
                    }
                }

                ++walkers[i];

                if (walkers[i] > 1) {
                    walkers[i] = 0;

                    if (i == 0) {
                        end = true;
                        break;
                    } else {
                        --i;
                    }
                } else {
                    break;
                }
            } while (!end);
        } while (!end);

        bx_expects(start_it_flat_constraints >= 0);
        bx_expects(nb_solution > 0);

        constraints.emplace(
          k, start_it_flat_constraints, nb_solution, bk_min, bk_max);
    }